

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cc
# Opt level: O1

uchar * __thiscall phosg::SHA256::SHA256(SHA256 *this,uchar *d,size_t n,uchar *md)

{
  long lVar1;
  size_t sVar2;
  uchar *puVar3;
  uchar *extraout_RAX;
  long lVar4;
  ulong uVar5;
  size_t z;
  uchar *puVar6;
  StringWriter w;
  anon_class_8_1_8991fb9c process_block;
  char local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  anon_class_8_1_8991fb9c local_28;
  
  this->h[0] = 0x6a09e667;
  this->h[1] = 0xbb67ae85;
  this->h[2] = 0x3c6ef372;
  this->h[3] = 0xa54ff53a;
  this->h[4] = 0x510e527f;
  this->h[5] = 0x9b05688c;
  this->h[6] = 0x1f83d9ab;
  this->h[7] = 0x5be0cd19;
  local_28.this = this;
  if (n < 0x40) {
    lVar1 = 0;
  }
  else {
    lVar4 = 0;
    do {
      SHA256::anon_class_8_1_8991fb9c::operator()(&local_28,d + lVar4);
      lVar1 = lVar4 + 0x40;
      uVar5 = lVar4 + 0x7f;
      lVar4 = lVar1;
    } while (uVar5 < n);
  }
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  StringWriter::write((StringWriter *)&local_48,(int)d + (int)lVar1,(void *)(n - lVar1),(size_t)md);
  local_49 = -0x80;
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_48,&local_49,1);
  sVar2 = StringWriter::size((StringWriter *)&local_48);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (&local_48,(ulong)(0x38 < sVar2) * 0x40 + 0x40,'\0');
  sVar2 = StringWriter::size((StringWriter *)&local_48);
  if (local_48._M_string_length < sVar2) {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              (&local_48,sVar2,'\0');
  }
  uVar5 = n << 3;
  *(ulong *)(local_48._M_dataplus._M_p + (sVar2 - 8)) =
       uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
       (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
       (uVar5 & 0xff00) << 0x28 | n << 0x3b;
  for (puVar6 = (uchar *)0x0; puVar3 = (uchar *)StringWriter::size((StringWriter *)&local_48),
      puVar6 < puVar3; puVar6 = puVar6 + 0x40) {
    SHA256::anon_class_8_1_8991fb9c::operator()(&local_28,local_48._M_dataplus._M_p + (long)puVar6);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
    puVar3 = extraout_RAX;
  }
  return puVar3;
}

Assistant:

SHA256::SHA256(const void* data, size_t size) {
  this->h[0] = 0x6A09E667;
  this->h[1] = 0xBB67AE85;
  this->h[2] = 0x3C6EF372;
  this->h[3] = 0xA54FF53A;
  this->h[4] = 0x510E527F;
  this->h[5] = 0x9B05688C;
  this->h[6] = 0x1F83D9AB;
  this->h[7] = 0x5BE0CD19;

  // clang-format off
  static const uint32_t k[64] = {
    0x428A2F98, 0x71374491, 0xB5C0FBCF, 0xE9B5DBA5, 0x3956C25B, 0x59F111F1, 0x923F82A4, 0xAB1C5ED5,
    0xD807AA98, 0x12835B01, 0x243185BE, 0x550C7DC3, 0x72BE5D74, 0x80DEB1FE, 0x9BDC06A7, 0xC19BF174,
    0xE49B69C1, 0xEFBE4786, 0x0FC19DC6, 0x240CA1CC, 0x2DE92C6F, 0x4A7484AA, 0x5CB0A9DC, 0x76F988DA,
    0x983E5152, 0xA831C66D, 0xB00327C8, 0xBF597FC7, 0xC6E00BF3, 0xD5A79147, 0x06CA6351, 0x14292967,
    0x27B70A85, 0x2E1B2138, 0x4D2C6DFC, 0x53380D13, 0x650A7354, 0x766A0ABB, 0x81C2C92E, 0x92722C85,
    0xA2BFE8A1, 0xA81A664B, 0xC24B8B70, 0xC76C51A3, 0xD192E819, 0xD6990624, 0xF40E3585, 0x106AA070,
    0x19A4C116, 0x1E376C08, 0x2748774C, 0x34B0BCB5, 0x391C0CB3, 0x4ED8AA4A, 0x5B9CCA4F, 0x682E6FF3,
    0x748F82EE, 0x78A5636F, 0x84C87814, 0x8CC70208, 0x90BEFFFA, 0xA4506CEB, 0xBEF9A3F7, 0xC67178F2,
  };
  // clang-format on

  auto process_block = [this](const void* data) {
    uint32_t w[64];
    memcpy(w, data, 0x40);
#ifdef PHOSG_LITTLE_ENDIAN
    for (size_t x = 0; x < 16; x++) {
      w[x] = bswap32(w[x]);
    }
#endif

    for (size_t x = 16; x < 64; x++) {
      uint32_t s0 = rotate_right(w[x - 15], 7) ^ rotate_right(w[x - 15], 18) ^ (w[x - 15] >> 3);
      uint32_t s1 = rotate_right(w[x - 2], 17) ^ rotate_right(w[x - 2], 19) ^ (w[x - 2] >> 10);
      w[x] = w[x - 16] + s0 + w[x - 7] + s1;
    }

    uint32_t z[8];
    for (size_t x = 0; x < 8; x++) {
      z[x] = this->h[x];
    }

    for (size_t x = 0; x < 64; x++) {
      uint32_t s1 = rotate_right(z[4], 6) ^ rotate_right(z[4], 11) ^ rotate_right(z[4], 25);
      uint32_t s0 = rotate_right(z[0], 2) ^ rotate_right(z[0], 13) ^ rotate_right(z[0], 22);
      uint32_t temp1 = z[7] + s1 + ((z[4] & z[5]) ^ ((~z[4]) & z[6])) + k[x] + w[x];
      uint32_t temp2 = s0 + ((z[0] & z[1]) ^ (z[0] & z[2]) ^ (z[1] & z[2]));
      z[7] = z[6];
      z[6] = z[5];
      z[5] = z[4];
      z[4] = z[3] + temp1;
      z[3] = z[2];
      z[2] = z[1];
      z[1] = z[0];
      z[0] = temp1 + temp2;
    }

    for (size_t x = 0; x < 8; x++) {
      this->h[x] += z[x];
    }
  };

  // Process all possible blocks from the input until just before the end
  size_t processed_offset;
  for (processed_offset = 0; processed_offset + 0x3F < size; processed_offset += 0x40) {
    process_block(reinterpret_cast<const uint8_t*>(data) + processed_offset);
  }

  // Make a copy of the last (possibly incomplete) block, append the trailer,
  // and process what remains. This could result in either one or two blocks.
  StringWriter w;
  w.write(reinterpret_cast<const char*>(data) + processed_offset, size - processed_offset);
  {
    w.put_u8(0x80);
    w.extend_to((w.size() > 0x38) ? 0x80 : 0x40, '\0');
    w.pput_u64b(w.size() - 8, size << 3);
  }
  for (size_t z = 0; z < w.size(); z += 0x40) {
    process_block(w.str().data() + z);
  }
}